

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input_source_delay.cc
# Opt level: O3

void __thiscall
sptk::InputSourceDelay::InputSourceDelay
          (InputSourceDelay *this,int delay,bool keep_sequence_length,InputSourceInterface *source)

{
  int iVar1;
  vector<double,_std::allocator<double>_> data;
  value_type local_38;
  
  (this->super_InputSourceInterface)._vptr_InputSourceInterface =
       (_func_int **)&PTR__InputSourceDelay_00110c48;
  this->delay_ = delay;
  this->keep_sequence_length_ = keep_sequence_length;
  this->source_ = source;
  this->is_valid_ = true;
  (this->queue_).c.
  super__Deque_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  (this->queue_).c.
  super__Deque_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Deque_impl_data._M_map_size = 0;
  (this->queue_).c.
  super__Deque_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  (this->queue_).c.
  super__Deque_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  (this->queue_).c.
  super__Deque_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  (this->queue_).c.
  super__Deque_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  (this->queue_).c.
  super__Deque_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  (this->queue_).c.
  super__Deque_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  (this->queue_).c.
  super__Deque_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  (this->queue_).c.
  super__Deque_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  std::
  _Deque_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::_M_initialize_map((_Deque_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                       *)&this->queue_,0);
  if ((this->source_ == (InputSourceInterface *)0x0) ||
     (iVar1 = (*this->source_->_vptr_InputSourceInterface[3])(), (char)iVar1 == '\0')) {
    this->is_valid_ = false;
    return;
  }
  local_38.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_38.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_38.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  if (this->delay_ < 1) {
    this->num_zeros_ = 0;
    if (delay < 0) {
      do {
        iVar1 = (*this->source_->_vptr_InputSourceInterface[4])(this->source_,&local_38);
        if ((char)iVar1 == '\0') break;
        iVar1 = this->num_zeros_ + 1;
        this->num_zeros_ = iVar1;
      } while (SBORROW4(iVar1,-delay) != iVar1 + delay < 0);
    }
  }
  else {
    this->num_zeros_ = 0;
    do {
      iVar1 = (*this->source_->_vptr_InputSourceInterface[4])(this->source_,&local_38);
      if ((char)iVar1 == '\0') break;
      std::
      deque<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::push_back(&(this->queue_).c,&local_38);
      iVar1 = this->num_zeros_ + 1;
      this->num_zeros_ = iVar1;
    } while (iVar1 < this->delay_);
    if (this->keep_sequence_length_ == false) {
      this->num_zeros_ = this->delay_;
    }
  }
  if (local_38.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start == (pointer)0x0) {
    return;
  }
  operator_delete(local_38.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start);
  return;
}

Assistant:

InputSourceDelay::InputSourceDelay(int delay, bool keep_sequence_length,
                                   InputSourceInterface* source)
    : delay_(delay),
      keep_sequence_length_(keep_sequence_length),
      source_(source),
      is_valid_(true) {
  if (NULL == source_ || !source_->IsValid()) {
    is_valid_ = false;
    return;
  }

  std::vector<double> data;
  if (delay_ <= 0) {
    // Skip data.
    for (num_zeros_ = 0; num_zeros_ < -delay; ++num_zeros_) {
      if (!source_->Get(&data)) {
        break;
      }
    }
  } else {
    // Store data.
    for (num_zeros_ = 0; num_zeros_ < delay_; ++num_zeros_) {
      if (!source_->Get(&data)) {
        break;
      }
      queue_.push(data);
    }
    if (!keep_sequence_length_) {
      num_zeros_ = delay_;
    }
  }
}